

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265_stream.cpp
# Opt level: O3

void h265_read_vps_rbsp(h265_stream_t *h,bs_t *b)

{
  vector<int,_std::allocator<int>_> *this;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  h265_vps_t *__s;
  byte *pbVar1;
  videoinfo_t *pvVar2;
  byte bVar3;
  uint32_t r_4;
  byte *pbVar4;
  pointer pvVar5;
  int iVar6;
  uint32_t r;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  uint32_t r_2;
  ulong uVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  long lVar16;
  long lVar17;
  bool bVar18;
  
  pbVar4 = b->p;
  uVar10 = b->bits_left;
  uVar12 = 0;
  iVar6 = 3;
  do {
    uVar10 = uVar10 - 1;
    b->bits_left = uVar10;
    uVar7 = 0;
    if (pbVar4 < b->end) {
      uVar7 = (uint)((*pbVar4 >> (uVar10 & 0x1f) & 1) != 0);
    }
    if (uVar10 == 0) {
      pbVar4 = pbVar4 + 1;
      b->p = pbVar4;
      b->bits_left = 8;
      uVar10 = 8;
    }
    uVar7 = (uint)uVar12 | uVar7 << ((byte)iVar6 & 0x1f);
    uVar12 = (ulong)uVar7;
    bVar18 = iVar6 != 0;
    iVar6 = iVar6 + -1;
  } while (bVar18);
  __s = h->vps_table[uVar12];
  h->vps = __s;
  bVar18 = false;
  memset(__s,0,0x4f0);
  __s->vps_video_parameter_set_id = (uint8_t)uVar7;
  uVar10 = b->bits_left - 1;
  b->bits_left = uVar10;
  pbVar4 = b->p;
  pbVar1 = b->end;
  if (pbVar4 < pbVar1) {
    bVar18 = (*pbVar4 >> (uVar10 & 0x1f) & 1) != 0;
  }
  if (uVar10 == 0) {
    pbVar4 = pbVar4 + 1;
    b->p = pbVar4;
    uVar10 = 8;
  }
  __s->vps_base_layer_internal_flag = bVar18;
  uVar10 = uVar10 - 1;
  b->bits_left = uVar10;
  if (pbVar4 < pbVar1) {
    bVar18 = (*pbVar4 >> (uVar10 & 0x1f) & 1) != 0;
  }
  else {
    bVar18 = false;
  }
  if (uVar10 == 0) {
    pbVar4 = pbVar4 + 1;
    b->p = pbVar4;
    uVar10 = 8;
  }
  __s->vps_base_layer_available_flag = bVar18;
  uVar7 = 0;
  iVar6 = 5;
  do {
    uVar10 = uVar10 - 1;
    b->bits_left = uVar10;
    uVar11 = 0;
    if (pbVar4 < pbVar1) {
      uVar11 = (uint)((*pbVar4 >> (uVar10 & 0x1f) & 1) != 0);
    }
    if (uVar10 == 0) {
      pbVar4 = pbVar4 + 1;
      b->p = pbVar4;
      b->bits_left = 8;
      uVar10 = 8;
    }
    bVar3 = (byte)iVar6 & 0x1f;
    uVar7 = uVar7 | uVar11 << bVar3;
    bVar18 = iVar6 != 0;
    iVar6 = iVar6 + -1;
  } while (bVar18);
  __s->vps_max_layers_minus1 = (uint8_t)uVar7;
  uVar7 = 0 << bVar3;
  iVar6 = 2;
  do {
    uVar10 = uVar10 - 1;
    b->bits_left = uVar10;
    uVar11 = 0;
    if (pbVar4 < pbVar1) {
      uVar11 = (uint)((*pbVar4 >> (uVar10 & 0x1f) & 1) != 0);
    }
    if (uVar10 == 0) {
      pbVar4 = pbVar4 + 1;
      b->p = pbVar4;
      b->bits_left = 8;
      uVar10 = 8;
    }
    bVar3 = (byte)iVar6 & 0x1f;
    uVar7 = uVar7 | uVar11 << bVar3;
    bVar18 = iVar6 != 0;
    iVar6 = iVar6 + -1;
  } while (bVar18);
  __s->vps_max_sub_layers_minus1 = (uint8_t)uVar7;
  uVar10 = uVar10 - 1;
  b->bits_left = uVar10;
  if (pbVar4 < pbVar1) {
    bVar18 = (*pbVar4 >> (uVar10 & 0x1f) & 1) != 0;
  }
  else {
    bVar18 = false;
  }
  if (uVar10 == 0) {
    pbVar4 = pbVar4 + 1;
    b->p = pbVar4;
    uVar10 = 8;
  }
  __s->vps_temporal_id_nesting_flag = bVar18;
  uVar11 = 0 << bVar3;
  iVar6 = 0xf;
  do {
    uVar10 = uVar10 - 1;
    b->bits_left = uVar10;
    uVar15 = 0;
    if (pbVar4 < pbVar1) {
      uVar15 = (uint)((*pbVar4 >> (uVar10 & 0x1f) & 1) != 0);
    }
    if (uVar10 == 0) {
      pbVar4 = pbVar4 + 1;
      b->p = pbVar4;
      b->bits_left = 8;
      uVar10 = 8;
    }
    uVar11 = uVar11 | uVar15 << ((byte)iVar6 & 0x1f);
    bVar18 = iVar6 != 0;
    iVar6 = iVar6 + -1;
  } while (bVar18);
  __s->vps_reserved_0xffff_16bits = uVar11;
  h265_read_ptl(&__s->ptl,b,1,uVar7 & 0xff);
  pvVar2 = h->info;
  pvVar2->profile_idc = (uint)(__s->ptl).general_profile_idc;
  pvVar2->level_idc = (uint)(__s->ptl).general_level_idc;
  pvVar2->tier_idc = (uint)(__s->ptl).general_tier_flag;
  uVar10 = b->bits_left - 1;
  b->bits_left = uVar10;
  pbVar4 = b->p;
  pbVar1 = b->end;
  bVar18 = false;
  if (pbVar4 < pbVar1) {
    bVar18 = (*pbVar4 >> (uVar10 & 0x1f) & 1) != 0;
  }
  if (uVar10 == 0) {
    pbVar4 = pbVar4 + 1;
    b->p = pbVar4;
    b->bits_left = 8;
  }
  __s->vps_sub_layer_ordering_info_present_flag = bVar18;
  uVar12 = 0;
  bVar3 = __s->vps_max_sub_layers_minus1;
  if (!bVar18) {
    uVar12 = (ulong)bVar3;
  }
  do {
    uVar7 = b->bits_left;
    uVar10 = 0xffffffff;
    iVar6 = -2;
    do {
      iVar14 = iVar6;
      uVar11 = uVar10;
      uVar7 = uVar7 - 1;
      b->bits_left = uVar7;
      bVar18 = true;
      if (pbVar4 < pbVar1) {
        bVar18 = (*pbVar4 >> (uVar7 & 0x1f) & 1) == 0;
      }
      if (uVar7 == 0) {
        pbVar4 = pbVar4 + 1;
        b->p = pbVar4;
        b->bits_left = 8;
        uVar7 = 8;
      }
      uVar10 = uVar11 + 1;
    } while (((bool)(bVar18 & uVar10 < 0x20)) && (iVar6 = iVar14 + 1, pbVar4 < pbVar1));
    uVar15 = 0;
    if (uVar10 != 0) {
      do {
        uVar7 = uVar7 - 1;
        b->bits_left = uVar7;
        uVar8 = 0;
        if (pbVar4 < pbVar1) {
          uVar8 = (uint)((*pbVar4 >> (uVar7 & 0x1f) & 1) != 0);
        }
        if (uVar7 == 0) {
          pbVar4 = pbVar4 + 1;
          b->p = pbVar4;
          b->bits_left = 8;
          uVar7 = 8;
        }
        uVar15 = uVar15 | uVar8 << ((byte)uVar11 & 0x1f);
        uVar11 = uVar11 - 1;
        iVar14 = iVar14 + -1;
      } while (iVar14 != -2);
    }
    __s->vps_max_dec_pic_buffering_minus1[uVar12] = ~(-1 << ((byte)uVar10 & 0x1f)) + uVar15;
    uVar10 = b->bits_left;
    uVar7 = 0xffffffff;
    iVar6 = -2;
    do {
      iVar14 = iVar6;
      uVar11 = uVar7;
      uVar10 = uVar10 - 1;
      b->bits_left = uVar10;
      bVar18 = true;
      if (pbVar4 < pbVar1) {
        bVar18 = (*pbVar4 >> (uVar10 & 0x1f) & 1) == 0;
      }
      if (uVar10 == 0) {
        pbVar4 = pbVar4 + 1;
        b->p = pbVar4;
        b->bits_left = 8;
        uVar10 = 8;
      }
      uVar7 = uVar11 + 1;
    } while (((bool)(bVar18 & uVar7 < 0x20)) && (iVar6 = iVar14 + 1, pbVar4 < pbVar1));
    uVar15 = 0;
    if (uVar7 != 0) {
      do {
        uVar10 = uVar10 - 1;
        b->bits_left = uVar10;
        uVar8 = 0;
        if (pbVar4 < pbVar1) {
          uVar8 = (uint)((*pbVar4 >> (uVar10 & 0x1f) & 1) != 0);
        }
        if (uVar10 == 0) {
          pbVar4 = pbVar4 + 1;
          b->p = pbVar4;
          b->bits_left = 8;
          uVar10 = 8;
        }
        uVar15 = uVar15 | uVar8 << ((byte)uVar11 & 0x1f);
        uVar11 = uVar11 - 1;
        iVar14 = iVar14 + -1;
      } while (iVar14 != -2);
    }
    __s->vps_max_num_reorder_pics[uVar12] = ~(-1 << ((byte)uVar7 & 0x1f)) + uVar15;
    uVar7 = b->bits_left;
    uVar10 = 0xffffffff;
    iVar6 = -2;
    do {
      iVar14 = iVar6;
      uVar11 = uVar10;
      uVar7 = uVar7 - 1;
      b->bits_left = uVar7;
      bVar18 = true;
      if (pbVar4 < pbVar1) {
        bVar18 = (*pbVar4 >> (uVar7 & 0x1f) & 1) == 0;
      }
      if (uVar7 == 0) {
        pbVar4 = pbVar4 + 1;
        b->p = pbVar4;
        b->bits_left = 8;
        uVar7 = 8;
      }
      uVar10 = uVar11 + 1;
    } while (((bool)(bVar18 & uVar10 < 0x20)) && (iVar6 = iVar14 + 1, pbVar4 < pbVar1));
    uVar15 = 0;
    if (uVar10 != 0) {
      do {
        uVar7 = uVar7 - 1;
        b->bits_left = uVar7;
        uVar8 = 0;
        if (pbVar4 < pbVar1) {
          uVar8 = (uint)((*pbVar4 >> (uVar7 & 0x1f) & 1) != 0);
        }
        if (uVar7 == 0) {
          pbVar4 = pbVar4 + 1;
          b->p = pbVar4;
          b->bits_left = 8;
          uVar7 = 8;
        }
        uVar15 = uVar15 | uVar8 << ((byte)uVar11 & 0x1f);
        uVar11 = uVar11 - 1;
        iVar14 = iVar14 + -1;
      } while (iVar14 != -2);
    }
    __s->vps_max_latency_increase_plus1[uVar12] = ~(-1 << ((byte)uVar10 & 0x1f)) + uVar15;
    uVar12 = uVar12 + 1;
  } while (uVar12 != (ulong)bVar3 + 1);
  uVar10 = b->bits_left;
  uVar7 = 0;
  iVar6 = 5;
  do {
    uVar10 = uVar10 - 1;
    b->bits_left = uVar10;
    uVar11 = 0;
    if (pbVar4 < pbVar1) {
      uVar11 = (uint)((*pbVar4 >> (uVar10 & 0x1f) & 1) != 0);
    }
    if (uVar10 == 0) {
      pbVar4 = pbVar4 + 1;
      b->p = pbVar4;
      b->bits_left = 8;
      uVar10 = 8;
    }
    bVar3 = (byte)iVar6 & 0x1f;
    uVar7 = uVar7 | uVar11 << bVar3;
    bVar18 = iVar6 != 0;
    iVar6 = iVar6 + -1;
  } while (bVar18);
  __s->vps_max_layer_id = (uint8_t)uVar7;
  uVar7 = 0xffffffff;
  iVar6 = 0 << bVar3;
  do {
    uVar10 = uVar10 - 1;
    b->bits_left = uVar10;
    bVar18 = true;
    if (pbVar4 < pbVar1) {
      bVar18 = (*pbVar4 >> (uVar10 & 0x1f) & 1) == 0;
    }
    if (uVar10 == 0) {
      pbVar4 = pbVar4 + 1;
      b->p = pbVar4;
      b->bits_left = 8;
      uVar10 = 8;
    }
    uVar7 = uVar7 + 1;
    iVar6 = iVar6 + -1;
  } while (((bool)(bVar18 & uVar7 < 0x20)) && (pbVar4 < pbVar1));
  if (iVar6 == -1) {
    uVar7 = 0;
  }
  else {
    iVar14 = -2 - iVar6;
    iVar13 = -3 - iVar6;
    uVar7 = 0;
    do {
      uVar10 = uVar10 - 1;
      b->bits_left = uVar10;
      uVar11 = 0;
      if (pbVar4 < pbVar1) {
        uVar11 = (uint)((*pbVar4 >> (uVar10 & 0x1f) & 1) != 0);
      }
      if (uVar10 == 0) {
        pbVar4 = pbVar4 + 1;
        b->p = pbVar4;
        b->bits_left = 8;
        uVar10 = 8;
      }
      uVar7 = uVar7 | uVar11 << ((byte)iVar14 & 0x1f);
      iVar13 = iVar13 + -1;
      iVar14 = iVar14 + -1;
    } while (iVar13 != -2);
  }
  uVar10 = -1 << (~(byte)iVar6 & 0x1f);
  __s->vps_num_layer_sets_minus1 = ~uVar10 + uVar7;
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::resize(&__s->layer_id_included_flag,(long)(int)(uVar7 - uVar10));
  pvVar5 = (__s->layer_id_included_flag).
           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((__s->layer_id_included_flag).
      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pvVar5) {
    uVar12 = 0;
    uVar9 = 1;
    do {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (pvVar5 + uVar12,(ulong)__s->vps_max_layer_id);
      pvVar5 = (__s->layer_id_included_flag).
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar12 = ((long)(__s->layer_id_included_flag).
                      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar5 >> 3) *
               -0x5555555555555555;
      bVar18 = uVar9 <= uVar12;
      lVar16 = uVar12 - uVar9;
      uVar12 = uVar9;
      uVar9 = (ulong)((int)uVar9 + 1);
    } while (bVar18 && lVar16 != 0);
  }
  uVar12 = (ulong)(uint)__s->vps_num_layer_sets_minus1;
  if (0 < __s->vps_num_layer_sets_minus1) {
    lVar17 = 0x18;
    lVar16 = 0;
    do {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 ((long)&(((__s->layer_id_included_flag).
                           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                         super__Vector_impl_data + lVar17),(long)((int)uVar12 + 1));
      uVar12 = (ulong)__s->vps_num_layer_sets_minus1;
      lVar16 = lVar16 + 1;
      lVar17 = lVar17 + 0x18;
    } while (lVar16 < (long)uVar12);
    if (0 < __s->vps_num_layer_sets_minus1) {
      lVar16 = 1;
      do {
        uVar12 = 0xffffffffffffffff;
        do {
          uVar10 = b->bits_left - 1;
          b->bits_left = uVar10;
          pbVar4 = b->p;
          if (pbVar4 < b->end) {
            bVar18 = (*pbVar4 >> (uVar10 & 0x1f) & 1) != 0;
          }
          else {
            bVar18 = false;
          }
          if (uVar10 == 0) {
            b->p = pbVar4 + 1;
            b->bits_left = 8;
          }
          *(bool *)(*(long *)&(__s->layer_id_included_flag).
                              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[lVar16].
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data + 1 + uVar12) = bVar18;
          uVar12 = uVar12 + 1;
        } while (uVar12 < __s->vps_max_layer_id);
        bVar18 = lVar16 < __s->vps_num_layer_sets_minus1;
        lVar16 = lVar16 + 1;
      } while (bVar18);
    }
  }
  uVar10 = b->bits_left - 1;
  b->bits_left = uVar10;
  pbVar4 = b->p;
  pbVar1 = b->end;
  bVar18 = false;
  if (pbVar4 < pbVar1) {
    bVar18 = (*pbVar4 >> (uVar10 & 0x1f) & 1) != 0;
  }
  if (uVar10 == 0) {
    pbVar4 = pbVar4 + 1;
    b->p = pbVar4;
    b->bits_left = 8;
    uVar10 = 8;
  }
  __s->vps_timing_info_present_flag = bVar18;
  if (bVar18) {
    uVar7 = 0;
    iVar6 = 0x1f;
    do {
      uVar10 = uVar10 - 1;
      b->bits_left = uVar10;
      uVar11 = 0;
      if (pbVar4 < pbVar1) {
        uVar11 = (uint)((*pbVar4 >> (uVar10 & 0x1f) & 1) != 0);
      }
      if (uVar10 == 0) {
        pbVar4 = pbVar4 + 1;
        b->p = pbVar4;
        b->bits_left = 8;
        uVar10 = 8;
      }
      uVar7 = uVar7 | uVar11 << ((byte)iVar6 & 0x1f);
      bVar18 = iVar6 != 0;
      iVar6 = iVar6 + -1;
    } while (bVar18);
    __s->vps_num_units_in_tick = uVar7;
    uVar7 = 0;
    iVar6 = 0x1f;
    do {
      uVar10 = uVar10 - 1;
      b->bits_left = uVar10;
      uVar11 = 0;
      if (pbVar4 < pbVar1) {
        uVar11 = (uint)((*pbVar4 >> (uVar10 & 0x1f) & 1) != 0);
      }
      if (uVar10 == 0) {
        pbVar4 = pbVar4 + 1;
        b->p = pbVar4;
        b->bits_left = 8;
        uVar10 = 8;
      }
      bVar3 = (byte)iVar6 & 0x1f;
      uVar7 = uVar7 | uVar11 << bVar3;
      bVar18 = iVar6 != 0;
      iVar6 = iVar6 + -1;
    } while (bVar18);
    __s->vps_time_scale = uVar7;
    uVar10 = uVar10 - 1;
    b->bits_left = uVar10;
    bVar18 = false;
    if (pbVar4 < pbVar1) {
      bVar18 = (*pbVar4 >> (uVar10 & 0x1f) & 1) != 0;
    }
    if (uVar10 == 0) {
      pbVar4 = pbVar4 + 1;
      b->p = pbVar4;
      uVar10 = 8;
    }
    __s->vps_poc_proportional_to_timing_flag = bVar18;
    if (bVar18) {
      uVar7 = 0xffffffff;
      iVar6 = 0 << bVar3;
      do {
        uVar10 = uVar10 - 1;
        b->bits_left = uVar10;
        bVar18 = true;
        if (pbVar4 < pbVar1) {
          bVar18 = (*pbVar4 >> (uVar10 & 0x1f) & 1) == 0;
        }
        if (uVar10 == 0) {
          pbVar4 = pbVar4 + 1;
          b->p = pbVar4;
          b->bits_left = 8;
          uVar10 = 8;
        }
        uVar7 = uVar7 + 1;
        iVar6 = iVar6 + -1;
      } while (((bool)(bVar18 & uVar7 < 0x20)) && (pbVar4 < pbVar1));
      if (iVar6 == -1) {
        uVar7 = 0;
      }
      else {
        iVar14 = -2 - iVar6;
        iVar13 = -3 - iVar6;
        uVar7 = 0;
        do {
          uVar10 = uVar10 - 1;
          b->bits_left = uVar10;
          uVar11 = 0;
          if (pbVar4 < pbVar1) {
            uVar11 = (uint)((*pbVar4 >> (uVar10 & 0x1f) & 1) != 0);
          }
          if (uVar10 == 0) {
            pbVar4 = pbVar4 + 1;
            b->p = pbVar4;
            b->bits_left = 8;
            uVar10 = 8;
          }
          uVar7 = uVar7 | uVar11 << ((byte)iVar14 & 0x1f);
          iVar13 = iVar13 + -1;
          iVar14 = iVar14 + -1;
        } while (iVar13 != -2);
      }
      __s->vps_num_ticks_poc_diff_one_minus1 = ~(-1 << (~(byte)iVar6 & 0x1f)) + uVar7;
    }
    uVar7 = 0xffffffff;
    iVar6 = 0;
    do {
      uVar10 = uVar10 - 1;
      b->bits_left = uVar10;
      bVar18 = true;
      if (pbVar4 < pbVar1) {
        bVar18 = (*pbVar4 >> (uVar10 & 0x1f) & 1) == 0;
      }
      if (uVar10 == 0) {
        pbVar4 = pbVar4 + 1;
        b->p = pbVar4;
        b->bits_left = 8;
        uVar10 = 8;
      }
      uVar7 = uVar7 + 1;
      iVar6 = iVar6 + -1;
    } while (((bool)(bVar18 & uVar7 < 0x20)) && (pbVar4 < pbVar1));
    if (iVar6 == -1) {
      uVar7 = 0;
    }
    else {
      iVar14 = -2 - iVar6;
      iVar13 = -3 - iVar6;
      uVar7 = 0;
      do {
        uVar10 = uVar10 - 1;
        b->bits_left = uVar10;
        uVar11 = 0;
        if (pbVar4 < pbVar1) {
          uVar11 = (uint)((*pbVar4 >> (uVar10 & 0x1f) & 1) != 0);
        }
        if (uVar10 == 0) {
          pbVar4 = pbVar4 + 1;
          b->p = pbVar4;
          b->bits_left = 8;
          uVar10 = 8;
        }
        uVar7 = uVar7 | uVar11 << ((byte)iVar14 & 0x1f);
        iVar13 = iVar13 + -1;
        iVar14 = iVar14 + -1;
      } while (iVar13 != -2);
    }
    iVar6 = ~(-1 << (~(byte)iVar6 & 0x1f)) + uVar7;
    __s->vps_num_hrd_parameters = iVar6;
    this = &__s->hrd_layer_set_idx;
    std::vector<int,_std::allocator<int>_>::resize(this,(long)iVar6);
    this_00 = &__s->cprms_present_flag;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (this_00,(long)__s->vps_num_hrd_parameters);
    std::vector<int,_std::allocator<int>_>::resize(this,(long)__s->vps_num_hrd_parameters);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (this_00,(long)__s->vps_num_hrd_parameters);
    if (0 < __s->vps_num_hrd_parameters) {
      lVar16 = 0;
      do {
        pbVar4 = b->p;
        pbVar1 = b->end;
        uVar10 = b->bits_left;
        uVar7 = 0xffffffff;
        iVar6 = -2;
        do {
          iVar14 = iVar6;
          uVar11 = uVar7;
          uVar10 = uVar10 - 1;
          b->bits_left = uVar10;
          bVar18 = true;
          if (pbVar4 < pbVar1) {
            bVar18 = (*pbVar4 >> (uVar10 & 0x1f) & 1) == 0;
          }
          if (uVar10 == 0) {
            pbVar4 = pbVar4 + 1;
            b->p = pbVar4;
            b->bits_left = 8;
            uVar10 = 8;
          }
          uVar7 = uVar11 + 1;
        } while (((bool)(bVar18 & uVar7 < 0x20)) && (iVar6 = iVar14 + 1, pbVar4 < pbVar1));
        uVar15 = 0;
        if (uVar7 != 0) {
          do {
            uVar10 = uVar10 - 1;
            b->bits_left = uVar10;
            uVar8 = 0;
            if (pbVar4 < pbVar1) {
              uVar8 = (uint)((*pbVar4 >> (uVar10 & 0x1f) & 1) != 0);
            }
            if (uVar10 == 0) {
              pbVar4 = pbVar4 + 1;
              b->p = pbVar4;
              b->bits_left = 8;
              uVar10 = 8;
            }
            uVar15 = uVar15 | uVar8 << ((byte)uVar11 & 0x1f);
            uVar11 = uVar11 - 1;
            iVar14 = iVar14 + -1;
          } while (iVar14 != -2);
        }
        (this->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_start[lVar16] = ~(-1 << ((byte)uVar7 & 0x1f)) + uVar15;
        if (lVar16 != 0) {
          uVar10 = b->bits_left - 1;
          b->bits_left = uVar10;
          if (pbVar4 < pbVar1) {
            bVar18 = (*pbVar4 >> (uVar10 & 0x1f) & 1) != 0;
          }
          else {
            bVar18 = false;
          }
          if (uVar10 == 0) {
            b->p = pbVar4 + 1;
            b->bits_left = 8;
          }
          (this_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
          super__Vector_impl_data._M_start[lVar16] = bVar18;
        }
        h265_read_hrd_parameters
                  (&__s->hrd_parameters,b,
                   (uint)(__s->cprms_present_flag).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar16],
                   (uint)__s->vps_max_sub_layers_minus1);
        lVar16 = lVar16 + 1;
      } while (lVar16 < __s->vps_num_hrd_parameters);
    }
  }
  uVar10 = b->bits_left - 1;
  b->bits_left = uVar10;
  pbVar4 = b->p;
  pbVar1 = b->end;
  bVar18 = false;
  if (pbVar4 < pbVar1) {
    bVar18 = (*pbVar4 >> (uVar10 & 0x1f) & 1) != 0;
  }
  if (uVar10 == 0) {
    pbVar4 = pbVar4 + 1;
    b->p = pbVar4;
    b->bits_left = 8;
    uVar10 = 8;
  }
  __s->vps_extension_flag = bVar18;
  if ((pbVar4 < pbVar1 & bVar18) == 1) {
    do {
      uVar10 = uVar10 - 1;
      if (uVar10 == 0) {
        pbVar4 = pbVar4 + 1;
        b->p = pbVar4;
        uVar10 = 8;
      }
    } while (pbVar4 < pbVar1);
    b->bits_left = uVar10;
  }
  h265_read_rbsp_trailing_bits(b);
  return;
}

Assistant:

void  h265_read_vps_rbsp(h265_stream_t* h, bs_t* b)
{
    int i = 0;
    int j = 0;

    int vps_video_parameter_set_id  = bs_read_u(b, 4);
    // 选择正确的sps表
    h->vps = h->vps_table[vps_video_parameter_set_id];
    h265_vps_t* vps = h->vps;
    memset(vps, 0, sizeof(h265_vps_t));

    vps->vps_video_parameter_set_id    = vps_video_parameter_set_id;
    vps->vps_base_layer_internal_flag  = bs_read_u1(b);
    vps->vps_base_layer_available_flag = bs_read_u1(b);
    vps->vps_max_layers_minus1         = bs_read_u(b, 6);
    vps->vps_max_sub_layers_minus1     = bs_read_u(b, 3);
    vps->vps_temporal_id_nesting_flag  = bs_read_u1(b);
    vps->vps_reserved_0xffff_16bits    = bs_read_u(b, 16);

    // profile tier level...
    h265_read_ptl(&vps->ptl, b, 1, vps->vps_max_sub_layers_minus1);
    h->info->profile_idc = vps->ptl.general_profile_idc;
    h->info->level_idc   = vps->ptl.general_level_idc;
    h->info->tier_idc    = vps->ptl.general_tier_flag;

    vps->vps_sub_layer_ordering_info_present_flag = bs_read_u1(b);
    for (i = (vps->vps_sub_layer_ordering_info_present_flag ? 0 : vps->vps_max_sub_layers_minus1);
         i <= vps->vps_max_sub_layers_minus1; i++ )
    {
        vps->vps_max_dec_pic_buffering_minus1[i] = bs_read_ue(b);
        vps->vps_max_num_reorder_pics[i]         = bs_read_ue(b);
        vps->vps_max_latency_increase_plus1[i]   = bs_read_ue(b);
    }
    vps->vps_max_layer_id           = bs_read_u(b, 6);
    vps->vps_num_layer_sets_minus1  = bs_read_ue(b);
    vps->layer_id_included_flag.resize(vps->vps_num_layer_sets_minus1+1);
    for (unsigned int k = 0; k < vps->layer_id_included_flag.size(); k++)
    {
        vps->layer_id_included_flag[k].resize(vps->vps_max_layer_id);
    }
    for (i = 1; i <= vps->vps_num_layer_sets_minus1; i++)
    {
        vps->layer_id_included_flag[i].resize(vps->vps_num_layer_sets_minus1+1);
    }
    for (i = 1; i <= vps->vps_num_layer_sets_minus1; i++)
    {
        for (j = 0; j <= vps->vps_max_layer_id; j++)
        {
            vps->layer_id_included_flag[i][j] = bs_read_u1(b);
        }
    }
    vps->vps_timing_info_present_flag = bs_read_u1(b);
    if (vps->vps_timing_info_present_flag)
    {
        vps->vps_num_units_in_tick = bs_read_u(b, 32);
        vps->vps_time_scale = bs_read_u(b, 32);
        vps->vps_poc_proportional_to_timing_flag = bs_read_u1(b);
        if (vps->vps_poc_proportional_to_timing_flag)
        {
            vps->vps_num_ticks_poc_diff_one_minus1 = bs_read_ue(b);
        }
        vps->vps_num_hrd_parameters  = bs_read_ue(b);
        vps->hrd_layer_set_idx.resize(vps->vps_num_hrd_parameters);
        vps->cprms_present_flag.resize(vps->vps_num_hrd_parameters);
        vps->hrd_layer_set_idx.resize(vps->vps_num_hrd_parameters);
        vps->cprms_present_flag.resize(vps->vps_num_hrd_parameters);
        for (i = 0; i < vps->vps_num_hrd_parameters; i++)
        {
            vps->hrd_layer_set_idx[i] = bs_read_ue(b);
            if (i > 0)
            {
                vps->cprms_present_flag[i] = bs_read_u1(b);
            }
            //  hrd_parameters()
            h265_read_hrd_parameters(&(vps->hrd_parameters), b, vps->cprms_present_flag[i], vps->vps_max_sub_layers_minus1);
        }
    }
    vps->vps_extension_flag  = bs_read_u1(b);
    if (vps->vps_extension_flag)
    {
        while (h265_more_rbsp_trailing_data(b))
        {
            int sps_extension_data_flag = bs_read_u1(b);
        }
    }
    h265_read_rbsp_trailing_bits(b);
}